

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O3

Image * __thiscall sf::Texture::copyToImage(Image *__return_storage_ptr__,Texture *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  pointer __dest;
  size_t __n;
  pointer __src;
  TransientContextLock lock;
  TextureSaver save;
  vector<unsigned_char,_std::allocator<unsigned_char>_> allPixels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  TransientContextLock local_6e;
  allocator_type local_6d;
  TextureSaver local_6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  Image *local_38;
  ulong uVar6;
  
  if (this->m_texture == 0) {
    Image::Image(__return_storage_ptr__);
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(&local_6e);
    priv::TextureSaver::TextureSaver(&local_6c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_50,(ulong)((this->m_size).x * (this->m_size).y * 4),
               (allocator_type *)&local_68);
    uVar4 = (this->m_actualSize).x;
    uVar1 = (this->m_actualSize).y;
    if ((((this->m_size).x == uVar4) && ((this->m_size).y == uVar1)) &&
       (this->m_pixelsFlipped == false)) {
      glBindTexture(0xde1,this->m_texture);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                         ,0x167,"glBindTexture(GL_TEXTURE_2D, m_texture)");
      glGetTexImage(0xde1,0,0x1908,0x1401,
                    local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                         ,0x168,
                         "glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0])");
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_68,(ulong)(uVar4 * uVar1 * 4),&local_6d);
      local_38 = __return_storage_ptr__;
      glBindTexture(0xde1,this->m_texture);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                         ,0x170,"glBindTexture(GL_TEXTURE_2D, m_texture)");
      glGetTexImage(0xde1,0,0x1908,0x1401,
                    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                         ,0x171,
                         "glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &allPixels[0])"
                        );
      uVar4 = (this->m_size).y;
      if (uVar4 != 0) {
        uVar1 = (this->m_actualSize).x;
        iVar3 = uVar1 * 4;
        uVar5 = 0;
        uVar6 = (ulong)((uVar4 - 1) * iVar3);
        iVar2 = uVar1 * -4;
        if (this->m_pixelsFlipped == false) {
          uVar6 = uVar5;
          iVar2 = iVar3;
        }
        __src = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + uVar6;
        __n = (size_t)(int)((this->m_size).x << 2);
        __dest = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          memcpy(__dest,__src,__n);
          __src = __src + iVar2;
          __dest = __dest + __n;
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
        } while (uVar4 < (this->m_size).y);
      }
      __return_storage_ptr__ = local_38;
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        __return_storage_ptr__ = local_38;
      }
    }
    Image::Image(__return_storage_ptr__);
    Image::create(__return_storage_ptr__,(this->m_size).x,(this->m_size).y,
                  local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start);
    if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (Uint8 *)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    priv::TextureSaver::~TextureSaver(&local_6c);
    GlResource::TransientContextLock::~TransientContextLock(&local_6e);
  }
  return __return_storage_ptr__;
}

Assistant:

Image Texture::copyToImage() const
{
    // Easy case: empty texture
    if (!m_texture)
        return Image();

    TransientContextLock lock;

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    // Create an array of pixels
    std::vector<Uint8> pixels(m_size.x * m_size.y * 4);

#ifdef SFML_OPENGL_ES

    // OpenGL ES doesn't have the glGetTexImage function, the only way to read
    // from a texture is to bind it to a FBO and use glReadPixels
    GLuint frameBuffer = 0;
    glCheck(GLEXT_glGenFramebuffers(1, &frameBuffer));
    if (frameBuffer)
    {
        GLint previousFrameBuffer;
        glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &previousFrameBuffer));

        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0));
        glCheck(glReadPixels(0, 0, m_size.x, m_size.y, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0]));
        glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, previousFrameBuffer));
    }

#else

    if ((m_size == m_actualSize) && !m_pixelsFlipped)
    {
        // Texture is not padded nor flipped, we can use a direct copy
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0]));
    }
    else
    {
        // Texture is either padded or flipped, we have to use a slower algorithm

        // All the pixels will first be copied to a temporary array
        std::vector<Uint8> allPixels(m_actualSize.x * m_actualSize.y * 4);
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_UNSIGNED_BYTE, &allPixels[0]));

        // Then we copy the useful pixels from the temporary array to the final one
        const Uint8* src = &allPixels[0];
        Uint8* dst = &pixels[0];
        int srcPitch = m_actualSize.x * 4;
        int dstPitch = m_size.x * 4;

        // Handle the case where source pixels are flipped vertically
        if (m_pixelsFlipped)
        {
            src += srcPitch * (m_size.y - 1);
            srcPitch = -srcPitch;
        }

        for (unsigned int i = 0; i < m_size.y; ++i)
        {
            std::memcpy(dst, src, dstPitch);
            src += srcPitch;
            dst += dstPitch;
        }
    }

#endif // SFML_OPENGL_ES

    // Create the image
    Image image;
    image.create(m_size.x, m_size.y, &pixels[0]);

    return image;
}